

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O0

int optimizeBlock(void)

{
  int iVar1;
  int local_c;
  
  if (*p == '[') {
    p = p + 1;
    skipSpaces();
    if (*p == ']') {
      genInstruction(5,0);
      p = p + 1;
      skipSpaces();
      local_c = 1;
    }
    else {
      while (iVar1 = parseStatement(), iVar1 != 0) {
        if (*p == '.') {
          p = p + 1;
          skipSpaces();
        }
        if (*p == ']') {
          p = p + 1;
          skipSpaces();
          goto LAB_001069a4;
        }
        genInstruction(0xf,5);
      }
      local_c = 0;
    }
  }
  else {
    iVar1 = parseTerm();
    if (iVar1 == 0) {
      local_c = 0;
    }
    else {
      parseError("missing block as optimized block argument");
LAB_001069a4:
      local_c = 1;
    }
  }
  return local_c;
}

Assistant:

int optimizeBlock(void)
{
    if (*p != '[') {
        if (!parseTerm())
            return 0;
        parseError("missing block as optimized block argument");
    } else {
        p++;
        skipSpaces();
        if (*p == ']') {
            genInstruction(PushConstant, 0);
            p++;
            skipSpaces();
            return 1;
        }
        while (1) {
            if (!parseStatement())
                return 0;
            if (*p == '.')
                p++, skipSpaces();
            if (*p == ']')
                break;
            genInstruction(DoSpecial, PopTop);
        }
        p++;
        skipSpaces();
        /* just leave last expression on stack */
    }
    return 1;
}